

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cliloop.c
# Opt level: O3

void cli_main_loop(cliloop_pw_setup_t pw_setup,cliloop_pw_check_t pw_check,cliloop_continue_t cont,
                  void *ctx)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  pollwrapper *pw;
  void *ptr;
  int *piVar4;
  unsigned_long uVar5;
  size_t oldlen;
  long lVar6;
  cliloop_pw_setup_t p_Var7;
  long lVar8;
  long lVar9;
  int fdstate;
  int rwx;
  unsigned_long next;
  size_t fdsize;
  int local_7c;
  int local_74;
  unsigned_long local_70;
  void *local_68;
  int local_5c;
  cliloop_pw_setup_t local_58;
  unsigned_long local_50;
  cliloop_pw_check_t local_48;
  cliloop_continue_t local_40;
  size_t local_38;
  
  local_48 = pw_check;
  local_40 = cont;
  local_70 = getticks();
  local_38 = 0;
  ptr = (void *)0x0;
  pw = pollwrap_new();
  local_68 = ctx;
  local_58 = pw_setup;
  do {
    p_Var7 = local_58;
    pollwrap_clear(pw);
    while( true ) {
      _Var1 = (*p_Var7)(ctx,pw);
      if (!_Var1) goto LAB_00112df0;
      iVar2 = first_fd(&local_74,&local_5c);
      oldlen = 0;
      while (-1 < iVar2) {
        oldlen = oldlen + 1;
        iVar2 = next_fd(&local_74,&local_5c);
      }
      ptr = safegrowarray(ptr,&local_38,4,oldlen,1,false);
      iVar2 = first_fd(&local_74,&local_5c);
      ctx = local_68;
      lVar8 = 0;
      while (-1 < iVar2) {
        *(int *)((long)ptr + lVar8 * 4) = iVar2;
        lVar8 = lVar8 + 1;
        pollwrap_add_fd_rwx(pw,iVar2,local_5c);
        iVar2 = next_fd(&local_74,&local_5c);
      }
      _Var1 = toplevel_callback_pending();
      if (_Var1) {
        local_7c = pollwrap_poll_instant(pw);
      }
      else {
        _Var1 = run_timers(local_70,&local_50);
        if (_Var1) goto LAB_00112cdc;
        local_7c = pollwrap_poll_endless(pw);
      }
      if (-1 < local_7c) break;
      piVar4 = __errno_location();
      if (*piVar4 != 4) goto LAB_00112e0f;
      pollwrap_clear(pw);
      p_Var7 = local_58;
    }
LAB_00112d55:
    if (lVar8 != 0) {
      lVar9 = 0;
      do {
        iVar2 = *(int *)((long)ptr + lVar9 * 4);
        uVar3 = pollwrap_get_fd_rwx(pw,iVar2);
        if ((uVar3 & 4) != 0) {
          select_result(iVar2,4);
        }
        if ((uVar3 & 1) != 0) {
          select_result(iVar2,1);
        }
        if ((uVar3 & 2) != 0) {
          select_result(iVar2,2);
        }
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
    }
    ctx = local_68;
    (*local_48)(local_68,pw);
    _Var1 = run_toplevel_callbacks();
    _Var1 = (*local_40)(ctx,local_7c != 0,_Var1);
    if (!_Var1) {
LAB_00112df0:
      pollwrap_free(pw);
      safefree(ptr);
      return;
    }
  } while( true );
LAB_00112cdc:
  uVar5 = getticks();
  lVar9 = 0;
  if (uVar5 - local_70 <= local_50 - local_70) {
    lVar9 = local_50 - uVar5;
  }
  lVar6 = lVar9;
  if (0x7ffffffe < lVar9) {
    lVar6 = 0x7fffffff;
  }
  local_7c = pollwrap_poll_timeout(pw,(int)lVar6);
  if (local_7c == 0 && lVar9 < 0x80000000) {
    local_7c = 0;
    local_70 = local_50;
    goto LAB_00112d55;
  }
  local_70 = getticks();
  if (-1 < local_7c) goto LAB_00112d55;
  piVar4 = __errno_location();
  if (*piVar4 != 4) {
LAB_00112e0f:
    cli_main_loop_cold_1();
    return;
  }
  goto LAB_00112cdc;
}

Assistant:

void cli_main_loop(cliloop_pw_setup_t pw_setup,
                   cliloop_pw_check_t pw_check,
                   cliloop_continue_t cont, void *ctx)
{
    unsigned long now = GETTICKCOUNT();

    int *fdlist = NULL;
    size_t fdsize = 0;

    pollwrapper *pw = pollwrap_new();

    while (true) {
        int rwx;
        int ret;
        int fdstate;
        unsigned long next;

        pollwrap_clear(pw);

        if (!pw_setup(ctx, pw))
            break; /* our client signalled emergency exit */

        /* Count the currently active fds. */
        size_t nfds = 0;
        for (int fd = first_fd(&fdstate, &rwx); fd >= 0;
             fd = next_fd(&fdstate, &rwx))
            nfds++;

        /* Expand the fdlist buffer if necessary. */
        sgrowarray(fdlist, fdsize, nfds);

        /*
         * Add all currently open uxsel fds to pw, and store them in
         * fdlist as well.
         */
        size_t fdcount = 0;
        for (int fd = first_fd(&fdstate, &rwx); fd >= 0;
             fd = next_fd(&fdstate, &rwx)) {
            fdlist[fdcount++] = fd;
            pollwrap_add_fd_rwx(pw, fd, rwx);
        }

        if (toplevel_callback_pending()) {
            ret = pollwrap_poll_instant(pw);
        } else if (run_timers(now, &next)) {
            do {
                unsigned long then;
                long ticks;

                then = now;
                now = GETTICKCOUNT();
                if (now - then > next - then)
                    ticks = 0;
                else
                    ticks = next - now;

                bool overflow = false;
                if (ticks > INT_MAX) {
                    ticks = INT_MAX;
                    overflow = true;
                }

                ret = pollwrap_poll_timeout(pw, ticks);
                if (ret == 0 && !overflow)
                    now = next;
                else
                    now = GETTICKCOUNT();
            } while (ret < 0 && errno == EINTR);
        } else {
            ret = pollwrap_poll_endless(pw);
        }

        if (ret < 0 && errno == EINTR)
            continue;

        if (ret < 0) {
            perror("poll");
            exit(1);
        }

        bool found_fd = (ret > 0);

        for (size_t i = 0; i < fdcount; i++) {
            int fd = fdlist[i];
            int rwx = pollwrap_get_fd_rwx(pw, fd);
            /*
             * We must process exceptional notifications before
             * ordinary readability ones, or we may go straight
             * past the urgent marker.
             */
            if (rwx & SELECT_X)
                select_result(fd, SELECT_X);
            if (rwx & SELECT_R)
                select_result(fd, SELECT_R);
            if (rwx & SELECT_W)
                select_result(fd, SELECT_W);
        }

        pw_check(ctx, pw);

        bool ran_callback = run_toplevel_callbacks();

        if (!cont(ctx, found_fd, ran_callback))
            break;
    }

    pollwrap_free(pw);
    sfree(fdlist);
}